

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O0

void __thiscall
wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::TopologicalOrdersImpl
          (TopologicalOrdersImpl<std::less<unsigned_int>_> *this,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,undefined8 param_3,undefined8 param_4,fd_set *param_5,timeval *param_6)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  bool bVar1;
  size_type sVar2;
  reference this_01;
  reference puVar3;
  ulong uVar4;
  reference pvVar5;
  fd_set *pfVar6;
  fd_set *__writefds;
  reference pvVar7;
  Index extraout_var;
  fd_set *__readfds;
  fd_set *__readfds_00;
  value_type local_98;
  uint local_8c;
  reference pvStack_88;
  Index i;
  value_type *first;
  Index local_78;
  uint local_74;
  const_iterator cStack_70;
  uint child;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vertex;
  const_iterator __end2;
  const_iterator __begin2;
  Graph_conflict *__range2;
  allocator<unsigned_int> local_21;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_20;
  Graph_conflict *graph_local;
  TopologicalOrdersImpl<std::less<unsigned_int>_> *this_local;
  
  this->graph = graph;
  local_20 = graph;
  graph_local = (Graph_conflict *)this;
  sVar2 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(graph);
  std::allocator<unsigned_int>::allocator(&local_21);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->indegrees,sVar2,&local_21)
  ;
  std::allocator<unsigned_int>::~allocator(&local_21);
  sVar2 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(local_20);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&__range2 + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->buf,sVar2,(allocator<unsigned_int> *)((long)&__range2 + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&__range2 + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->choiceHeap);
  std::
  vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  ::vector(&this->selectors);
  sVar2 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(local_20);
  this_00 = local_20;
  if (sVar2 != 0) {
    __end2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::begin(local_20);
    vertex = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                       *)&vertex), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::operator*(&__end2);
      __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
      cStack_70 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff90), bVar1) {
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end3);
        local_74 = *puVar3;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->indegrees,(ulong)local_74);
        *pvVar5 = *pvVar5 + 1;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::operator++(&__end2);
    }
    sVar2 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(local_20);
    std::
    vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
    ::reserve(&this->selectors,sVar2);
    first._0_4_ = 0;
    first._4_4_ = 0;
    local_78 = 0;
    std::
    vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
    ::push_back(&this->selectors,(value_type *)&first);
    pvStack_88 = std::
                 vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                 ::back(&this->selectors);
    for (local_8c = 0; uVar4 = (ulong)local_8c,
        sVar2 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::size(local_20), uVar4 < sVar2; local_8c = local_8c + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->indegrees,(ulong)local_8c);
      if (*pvVar5 == 0) {
        pushChoice(this,local_8c);
        pvStack_88->count = pvStack_88->count + 1;
      }
    }
    while( true ) {
      pfVar6 = (fd_set *)
               std::
               vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
               ::size(&this->selectors);
      __writefds = (fd_set *)
                   std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::size(local_20);
      if (__writefds <= pfVar6) break;
      pvVar7 = std::
               vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
               ::back(&this->selectors);
      local_98.start = Selector::select(pvVar7,(int)this,__readfds,__writefds,param_5,param_6);
      local_98.count = extraout_var;
      std::
      vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
      ::push_back(&this->selectors,&local_98);
    }
    pvVar7 = std::
             vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
             ::back(&this->selectors);
    Selector::select(pvVar7,(int)this,__readfds_00,__writefds,param_5,param_6);
  }
  return;
}

Assistant:

TopologicalOrdersImpl(const Graph& graph, Cmp cmp)
    : graph(graph), indegrees(graph.size()), buf(graph.size()), cmp(cmp) {
    if (graph.size() == 0) {
      return;
    }
    // Find the in-degree of each vertex.
    for (const auto& vertex : graph) {
      for (auto child : vertex) {
        ++indegrees[child];
      }
    }
    // Set up the first selector with its possible selections.
    selectors.reserve(graph.size());
    selectors.push_back({0, 0, 0});
    auto& first = selectors.back();
    for (Index i = 0; i < graph.size(); ++i) {
      if (indegrees[i] == 0) {
        if constexpr (useMinHeap) {
          pushChoice(i);
        } else {
          buf[first.count] = i;
        }
        ++first.count;
      }
    }
    // Initialize the full stack of selectors.
    while (selectors.size() < graph.size()) {
      selectors.push_back(selectors.back().select(*this));
    }
    selectors.back().select(*this);
  }